

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

float vkt::sr::anon_unknown_0::TextureTestUtil::computeLodFromDerivates
                (LodMode mode,float dudx,float dvdx,float dwdx,float dudy,float dvdy,float dwdy)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float in_XMM0_Db;
  float fVar5;
  float in_XMM1_Db;
  undefined1 auVar6 [16];
  float in_XMM2_Db;
  undefined1 auVar7 [16];
  float in_XMM3_Db;
  float in_XMM4_Db;
  float fVar8;
  float in_XMM5_Db;
  
  if (mode == LODMODE_EXACT) {
    auVar6._0_4_ = dvdx * dvdx;
    auVar6._4_4_ = dvdy * dvdy;
    auVar6._8_4_ = in_XMM1_Db * in_XMM1_Db;
    auVar6._12_4_ = in_XMM4_Db * in_XMM4_Db;
    auVar7._0_4_ = dwdx * dwdx + dudx * dudx + auVar6._0_4_;
    auVar7._4_4_ = dwdy * dwdy + dudy * dudy + auVar6._4_4_;
    auVar7._8_4_ = in_XMM2_Db * in_XMM2_Db + in_XMM0_Db * in_XMM0_Db + auVar6._8_4_;
    auVar7._12_4_ = in_XMM5_Db * in_XMM5_Db + in_XMM3_Db * in_XMM3_Db + auVar6._12_4_;
    auVar6 = sqrtps(auVar6,auVar7);
    fVar4 = auVar6._4_4_;
    uVar1 = -(uint)(fVar4 <= auVar6._0_4_);
    uVar2 = (uint)auVar6._0_4_ & uVar1;
  }
  else {
    uVar1 = -(uint)(-dudx <= dudx);
    uVar2 = -(uint)(-dudy <= dudy);
    fVar4 = (float)(~uVar1 & (uint)-dudx | (uint)dudx & uVar1);
    fVar3 = (float)(~uVar2 & (uint)-dudy | (uint)dudy & uVar2);
    uVar1 = -(uint)(fVar3 <= fVar4);
    fVar3 = (float)(~uVar1 & (uint)fVar3 | (uint)fVar4 & uVar1);
    uVar1 = -(uint)(-dvdx <= dvdx);
    uVar2 = -(uint)(-dvdy <= dvdy);
    fVar4 = (float)(~uVar1 & (uint)-dvdx | (uint)dvdx & uVar1);
    fVar5 = (float)(~uVar2 & (uint)-dvdy | (uint)dvdy & uVar2);
    uVar1 = -(uint)(fVar5 <= fVar4);
    fVar5 = (float)(~uVar1 & (uint)fVar5 | (uint)fVar4 & uVar1);
    uVar1 = -(uint)(-dwdx <= dwdx);
    uVar2 = -(uint)(-dwdy <= dwdy);
    fVar4 = (float)(~uVar1 & (uint)-dwdx | (uint)dwdx & uVar1);
    fVar8 = (float)(~uVar2 & (uint)-dwdy | (uint)dwdy & uVar2);
    uVar1 = -(uint)(fVar8 <= fVar4);
    fVar4 = (float)(~uVar1 & (uint)fVar8 | (uint)fVar4 & uVar1);
    if (mode != LODMODE_MIN_BOUND) {
      fVar4 = deFloatLog2(fVar3 + fVar5 + fVar4);
      return fVar4;
    }
    fVar3 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 | -(uint)(fVar5 <= fVar3) & (uint)fVar3);
    uVar1 = -(uint)(fVar4 <= fVar3);
    uVar2 = uVar1 & (uint)fVar3;
  }
  fVar4 = deFloatLog2((float)(~uVar1 & (uint)fVar4 | uVar2));
  return fVar4;
}

Assistant:

float computeLodFromDerivates (LodMode mode, float dudx, float dvdx, float dwdx, float dudy, float dvdy, float dwdy)
{
	float p = 0.0f;
	switch (mode)
	{
		case LODMODE_EXACT:
			p = de::max(deFloatSqrt(dudx*dudx + dvdx*dvdx + dwdx*dwdx), deFloatSqrt(dudy*dudy + dvdy*dvdy + dwdy*dwdy));
			break;

		case LODMODE_MIN_BOUND:
		case LODMODE_MAX_BOUND:
		{
			float mu = de::max(deFloatAbs(dudx), deFloatAbs(dudy));
			float mv = de::max(deFloatAbs(dvdx), deFloatAbs(dvdy));
			float mw = de::max(deFloatAbs(dwdx), deFloatAbs(dwdy));

			p = mode == LODMODE_MIN_BOUND ? de::max(de::max(mu, mv), mw) : (mu + mv + mw);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	return deFloatLog2(p);
}